

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *vec,int *ridx,int *rn,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *eps)

{
  uint *puVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  undefined1 auVar6 [16];
  fpclass_type fVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  cpp_dec_float<50U,_int,_void> *pcVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  int *piVar13;
  cpp_dec_float<50U,_int,_void> *pcVar14;
  undefined1 local_238 [16];
  uint local_228 [3];
  undefined3 uStack_21b;
  uint local_218 [3];
  bool local_20c;
  undefined8 local_208;
  ulong local_1f8;
  ulong local_1f0;
  cpp_dec_float<50U,_int,_void> local_1e8;
  int *local_1b0;
  pointer local_1a8;
  int *local_1a0;
  int *local_198;
  int *local_190;
  int *local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_180;
  cpp_dec_float<50U,_int,_void> local_178;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_138;
  ulong local_130;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_1e8.fpclass = cpp_dec_float_finite;
  local_1e8.prec_elem = 10;
  local_1e8.data._M_elems[0] = 0;
  local_1e8.data._M_elems[1] = 0;
  local_1e8.data._M_elems[2] = 0;
  local_1e8.data._M_elems[3] = 0;
  local_1e8.data._M_elems[4] = 0;
  local_1e8.data._M_elems[5] = 0;
  local_1e8.data._M_elems._24_5_ = 0;
  local_1e8.data._M_elems[7]._1_3_ = 0;
  local_1e8.data._M_elems[8] = 0;
  local_1e8.data._M_elems[9] = 0;
  local_1e8.exp = 0;
  local_1e8.neg = false;
  local_1a8 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1b0 = (this->l).idx;
  local_188 = (this->l).row;
  local_1a0 = (this->l).start;
  local_130 = (ulong)(this->l).firstUpdate;
  local_198 = ridx;
  local_190 = rn;
  local_180 = eps;
  if ((long)local_130 < 1) {
    local_1f8 = 0;
  }
  else {
    local_1f8 = 0;
    local_138 = this;
    do {
      iVar8 = local_188[local_1f8];
      local_1e8.data._M_elems._32_8_ = *(undefined8 *)(vec[iVar8].m_backend.data._M_elems + 8);
      local_1e8.data._M_elems._0_8_ = *(undefined8 *)vec[iVar8].m_backend.data._M_elems;
      local_1e8.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar8].m_backend.data._M_elems + 2);
      puVar1 = vec[iVar8].m_backend.data._M_elems + 4;
      local_1e8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_1e8.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_1e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_218[2] = vec[iVar8].m_backend.exp;
      local_1e8.neg = vec[iVar8].m_backend.neg;
      local_1e8.fpclass = vec[iVar8].m_backend.fpclass;
      local_1e8.prec_elem = vec[iVar8].m_backend.prec_elem;
      local_218._0_8_ = *(undefined8 *)(vec[iVar8].m_backend.data._M_elems + 8);
      puVar1 = vec[iVar8].m_backend.data._M_elems + 4;
      local_228._0_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      stack0xfffffffffffffde0 = (undefined5)uVar3;
      uStack_21b = (undefined3)((ulong)uVar3 >> 0x28);
      local_68.data._M_elems._0_8_ = *(undefined8 *)(local_180->m_backend).data._M_elems;
      local_68.data._M_elems._8_8_ = *(undefined8 *)((local_180->m_backend).data._M_elems + 2);
      local_68.data._M_elems._16_8_ = *(undefined8 *)((local_180->m_backend).data._M_elems + 4);
      local_68.data._M_elems._24_8_ = *(undefined8 *)((local_180->m_backend).data._M_elems + 6);
      local_68.data._M_elems._32_8_ = *(undefined8 *)((local_180->m_backend).data._M_elems + 8);
      local_68.exp = (local_180->m_backend).exp;
      local_68.neg = (local_180->m_backend).neg;
      local_68.fpclass = (local_180->m_backend).fpclass;
      local_68.prec_elem = (local_180->m_backend).prec_elem;
      local_208._4_4_ = local_1e8.prec_elem;
      local_208._0_4_ = local_1e8.fpclass;
      local_20c = local_1e8.neg;
      if ((local_1e8.neg == true) &&
         (local_238._0_4_ = (undefined4)*(undefined8 *)vec[iVar8].m_backend.data._M_elems,
         local_238._0_4_ != 0 || local_1e8.fpclass != cpp_dec_float_finite)) {
        local_20c = false;
      }
      local_1e8.exp = local_218[2];
      if ((local_68.fpclass != cpp_dec_float_NaN && local_1e8.fpclass != cpp_dec_float_NaN) &&
         (local_238 = *(undefined1 (*) [16])vec[iVar8].m_backend.data._M_elems,
         iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)local_238,&local_68), 0 < iVar8)) {
        local_1f0 = (ulong)local_1a0[local_1f8];
        iVar8 = local_1a0[local_1f8 + 1];
        if (local_1a0[local_1f8] < iVar8) {
          pcVar14 = &local_1a8[local_1f0].m_backend;
          piVar13 = local_1b0 + local_1f0;
          do {
            iVar10 = *piVar13;
            local_128.fpclass = cpp_dec_float_finite;
            local_128.prec_elem = 10;
            local_128.data._M_elems[0] = 0;
            local_128.data._M_elems[1] = 0;
            local_128.data._M_elems[2] = 0;
            local_128.data._M_elems[3] = 0;
            local_128.data._M_elems[4] = 0;
            local_128.data._M_elems[5] = 0;
            local_128.data._M_elems._24_5_ = 0;
            local_128.data._M_elems[7]._1_3_ = 0;
            local_128.data._M_elems[8] = 0;
            local_128.data._M_elems[9] = 0;
            local_128.exp = 0;
            local_128.neg = false;
            pcVar12 = &local_1e8;
            if (pcVar14 != &local_128) {
              local_128.data._M_elems[8] = local_1e8.data._M_elems[8];
              local_128.data._M_elems[9] = local_1e8.data._M_elems[9];
              local_128.data._M_elems[4] = local_1e8.data._M_elems[4];
              local_128.data._M_elems[5] = local_1e8.data._M_elems[5];
              local_128.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
              local_128.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
              local_128.data._M_elems[2] = local_1e8.data._M_elems[2];
              local_128.data._M_elems[3] = local_1e8.data._M_elems[3];
              local_128.data._M_elems[0] = local_1e8.data._M_elems[0];
              local_128.data._M_elems[1] = local_1e8.data._M_elems[1];
              local_128.exp = local_1e8.exp;
              local_128.neg = local_1e8.neg;
              local_128.fpclass = local_1e8.fpclass;
              local_128.prec_elem = local_1e8.prec_elem;
              pcVar12 = pcVar14;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_128,pcVar12);
            pcVar12 = &vec[iVar10].m_backend;
            if (vec[iVar10].m_backend.fpclass != cpp_dec_float_NaN) {
              local_208._0_4_ = cpp_dec_float_finite;
              local_208._4_4_ = 10;
              local_238 = (undefined1  [16])0x0;
              local_228[0] = 0;
              local_228[1] = 0;
              stack0xfffffffffffffde0 = 0;
              uStack_21b = 0;
              local_218[0] = 0;
              local_218[1] = 0;
              local_218[2] = 0;
              local_20c = false;
              pcVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
              local_238 = *(undefined1 (*) [16])(pcVar11->data)._M_elems;
              local_228._0_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
              stack0xfffffffffffffde0 = (undefined5)uVar3;
              uStack_21b = (undefined3)((ulong)uVar3 >> 0x28);
              local_218._0_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 8);
              local_218[2] = pcVar11->exp;
              local_20c = pcVar11->neg;
              local_208._0_4_ = pcVar11->fpclass;
              local_208._4_4_ = pcVar11->prec_elem;
              iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (pcVar12,(cpp_dec_float<50U,_int,_void> *)local_238);
              if (iVar9 == 0) {
                local_198[*local_190] = iVar10;
                *local_190 = *local_190 + 1;
              }
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (pcVar12,&local_128);
            if (pcVar12->fpclass != cpp_dec_float_NaN) {
              local_208._0_4_ = cpp_dec_float_finite;
              local_208._4_4_ = 10;
              local_238 = (undefined1  [16])0x0;
              local_228[0] = 0;
              local_228[1] = 0;
              stack0xfffffffffffffde0 = 0;
              uStack_21b = 0;
              local_218[0] = 0;
              local_218[1] = 0;
              local_218[2] = 0;
              local_20c = false;
              pcVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
              local_238 = *(undefined1 (*) [16])(pcVar11->data)._M_elems;
              local_228._0_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
              stack0xfffffffffffffde0 = (undefined5)uVar3;
              uStack_21b = (undefined3)((ulong)uVar3 >> 0x28);
              local_218._0_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 8);
              local_218[2] = pcVar11->exp;
              local_20c = pcVar11->neg;
              local_208._0_4_ = pcVar11->fpclass;
              local_208._4_4_ = pcVar11->prec_elem;
              iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (pcVar12,(cpp_dec_float<50U,_int,_void> *)local_238);
              if (iVar10 == 0) {
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)pcVar12,1e-100);
              }
            }
            piVar13 = piVar13 + 1;
            pcVar14 = pcVar14 + 1;
            iVar8 = iVar8 + -1;
          } while ((int)local_1f0 < iVar8);
        }
      }
      local_1f8 = local_1f8 + 1;
      this = local_138;
    } while (local_1f8 != local_130);
  }
  if (((this->l).updateType != 0) && (uVar2 = (this->l).firstUnused, (int)local_1f8 < (int)uVar2)) {
    local_1f0 = local_1f8 & 0xffffffff;
    local_1f8 = (ulong)uVar2;
    do {
      iVar8 = local_1a0[local_1f0];
      local_178.fpclass = cpp_dec_float_finite;
      local_178.prec_elem = 10;
      local_178.data._M_elems[0] = 0;
      local_178.data._M_elems[1] = 0;
      local_178.data._M_elems[2] = 0;
      local_178.data._M_elems[3] = 0;
      local_178.data._M_elems[4] = 0;
      local_178.data._M_elems[5] = 0;
      local_178.data._M_elems._24_5_ = 0;
      local_178.data._M_elems[7]._1_3_ = 0;
      local_178.data._M_elems[8] = 0;
      local_178.data._M_elems[9] = 0;
      local_178.exp = 0;
      local_178.neg = false;
      iVar10 = local_1a0[local_1f0 + 1];
      if (iVar8 < iVar10) {
        pcVar14 = &local_1a8[iVar8].m_backend;
        piVar13 = local_1b0 + iVar8;
        do {
          pcVar11 = &vec[*piVar13].m_backend;
          local_208._0_4_ = cpp_dec_float_finite;
          local_208._4_4_ = 10;
          local_238 = (undefined1  [16])0x0;
          local_228[0] = 0;
          local_228[1] = 0;
          stack0xfffffffffffffde0 = 0;
          uStack_21b = 0;
          local_218[0] = 0;
          local_218[1] = 0;
          local_218[2] = 0;
          local_20c = false;
          pcVar12 = pcVar11;
          if ((pcVar14 != (cpp_dec_float<50U,_int,_void> *)local_238) &&
             (pcVar12 = pcVar14, (cpp_dec_float<50U,_int,_void> *)local_238 != pcVar11)) {
            local_218._0_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<50U,_int,_void> *)&pcVar11->data)->data)._M_elems + 8);
            local_238 = *(undefined1 (*) [16])
                         (((cpp_dec_float<50U,_int,_void> *)&pcVar11->data)->data)._M_elems;
            local_228._0_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<50U,_int,_void> *)&pcVar11->data)->data)._M_elems + 4);
            uVar3 = *(undefined8 *)
                     ((((cpp_dec_float<50U,_int,_void> *)&pcVar11->data)->data)._M_elems + 6);
            stack0xfffffffffffffde0 = (undefined5)uVar3;
            uStack_21b = (undefined3)((ulong)uVar3 >> 0x28);
            local_218[2] = pcVar11->exp;
            local_20c = pcVar11->neg;
            local_208._0_4_ = pcVar11->fpclass;
            local_208._4_4_ = pcVar11->prec_elem;
          }
          piVar13 = piVar13 + 1;
          pcVar14 = pcVar14 + 1;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    ((cpp_dec_float<50U,_int,_void> *)local_238,pcVar12);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_178,(cpp_dec_float<50U,_int,_void> *)local_238);
          iVar10 = iVar10 + -1;
        } while (iVar8 < iVar10);
      }
      auVar6 = (undefined1  [16])local_178.data._M_elems._0_16_;
      uVar5 = local_1f0;
      iVar8 = local_188[local_1f0];
      local_1e8.data._M_elems[8] = local_178.data._M_elems[8];
      local_1e8.data._M_elems[9] = local_178.data._M_elems[9];
      local_1e8.data._M_elems[4] = local_178.data._M_elems[4];
      local_1e8.data._M_elems[5] = local_178.data._M_elems[5];
      local_1e8.data._M_elems._24_5_ = local_178.data._M_elems._24_5_;
      local_1e8.data._M_elems[7]._1_3_ = local_178.data._M_elems[7]._1_3_;
      local_1e8.data._M_elems[0] = local_178.data._M_elems[0];
      local_1e8.data._M_elems[1] = local_178.data._M_elems[1];
      uVar3 = local_1e8.data._M_elems._0_8_;
      local_1e8.data._M_elems[0] = local_178.data._M_elems[0];
      local_1e8.data._M_elems[1] = local_178.data._M_elems[1];
      local_1e8.data._M_elems[2] = local_178.data._M_elems[2];
      local_1e8.data._M_elems[3] = local_178.data._M_elems[3];
      fVar7 = local_178.fpclass;
      local_1e8.exp = local_178.exp;
      local_1e8.neg = local_178.neg;
      local_1e8.fpclass = local_178.fpclass;
      local_1e8.prec_elem = local_178.prec_elem;
      local_218[0] = local_178.data._M_elems[8];
      local_218[1] = local_178.data._M_elems[9];
      local_228[0] = local_178.data._M_elems[4];
      local_228[1] = local_178.data._M_elems[5];
      stack0xfffffffffffffde0 = local_178.data._M_elems._24_5_;
      uStack_21b = local_178.data._M_elems[7]._1_3_;
      local_178.data._M_elems[0] = auVar6._0_4_;
      local_178.data._M_elems[1] = auVar6._4_4_;
      local_178.data._M_elems[2] = auVar6._8_4_;
      local_178.data._M_elems[3] = auVar6._12_4_;
      local_238._0_4_ = local_178.data._M_elems[0];
      local_238._4_4_ = local_178.data._M_elems[1];
      local_238._8_4_ = local_178.data._M_elems[2];
      local_238._12_4_ = local_178.data._M_elems[3];
      auVar4 = local_238;
      local_a8.data._M_elems._32_8_ = *(undefined8 *)((local_180->m_backend).data._M_elems + 8);
      local_a8.data._M_elems._0_8_ = *(undefined8 *)(local_180->m_backend).data._M_elems;
      local_a8.data._M_elems._8_8_ = *(undefined8 *)((local_180->m_backend).data._M_elems + 2);
      local_a8.data._M_elems._16_8_ = *(undefined8 *)((local_180->m_backend).data._M_elems + 4);
      local_a8.data._M_elems._24_8_ = *(undefined8 *)((local_180->m_backend).data._M_elems + 6);
      local_a8.exp = (local_180->m_backend).exp;
      local_a8.neg = (local_180->m_backend).neg;
      local_a8.fpclass = (local_180->m_backend).fpclass;
      local_a8.prec_elem = (local_180->m_backend).prec_elem;
      local_218[2] = local_178.exp;
      local_20c = local_178.neg;
      local_208._0_4_ = local_178.fpclass;
      local_208._4_4_ = local_178.prec_elem;
      if ((local_178.neg == true) &&
         (local_238._0_4_ = auVar6._0_4_, local_238._0_4_ != 0 || fVar7 != cpp_dec_float_finite)) {
        local_20c = false;
      }
      if ((local_a8.fpclass != cpp_dec_float_NaN && fVar7 != cpp_dec_float_NaN) &&
         (local_238 = auVar4, local_178.data._M_elems._0_16_ = auVar6,
         iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)local_238,&local_a8),
         uVar3 = local_1e8.data._M_elems._0_8_, 0 < iVar10)) {
        local_e8.data._M_elems[8] = local_1e8.data._M_elems[8];
        local_e8.data._M_elems[9] = local_1e8.data._M_elems[9];
        local_e8.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
        local_e8.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
        local_e8.data._M_elems[4] = local_1e8.data._M_elems[4];
        local_e8.data._M_elems[5] = local_1e8.data._M_elems[5];
        local_e8.data._M_elems[0] = local_1e8.data._M_elems[0];
        local_e8.data._M_elems[1] = local_1e8.data._M_elems[1];
        local_e8.data._M_elems[2] = local_1e8.data._M_elems[2];
        local_e8.data._M_elems[3] = local_1e8.data._M_elems[3];
        local_e8.exp = local_1e8.exp;
        local_e8.neg = local_1e8.neg;
        local_e8.fpclass = local_1e8.fpclass;
        local_e8.prec_elem = local_1e8.prec_elem;
        pcVar14 = &vec[iVar8].m_backend;
        if (vec[iVar8].m_backend.fpclass != cpp_dec_float_NaN) {
          local_208._0_4_ = cpp_dec_float_finite;
          local_208._4_4_ = 10;
          local_238 = (undefined1  [16])0x0;
          local_228[0] = 0;
          local_228[1] = 0;
          stack0xfffffffffffffde0 = 0;
          uStack_21b = 0;
          local_218[0] = 0;
          local_218[1] = 0;
          local_218[2] = 0;
          local_20c = false;
          pcVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
          local_238 = *(undefined1 (*) [16])(pcVar12->data)._M_elems;
          local_228._0_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
          uVar3 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
          stack0xfffffffffffffde0 = (undefined5)uVar3;
          uStack_21b = (undefined3)((ulong)uVar3 >> 0x28);
          local_218._0_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 8);
          local_218[2] = pcVar12->exp;
          local_20c = pcVar12->neg;
          local_208._0_4_ = pcVar12->fpclass;
          local_208._4_4_ = pcVar12->prec_elem;
          iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (pcVar14,(cpp_dec_float<50U,_int,_void> *)local_238);
          if (iVar10 == 0) {
            local_198[*local_190] = iVar8;
            *local_190 = *local_190 + 1;
          }
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (pcVar14,&local_e8);
        uVar3 = local_1e8.data._M_elems._0_8_;
        if (pcVar14->fpclass != cpp_dec_float_NaN) {
          local_208._0_4_ = cpp_dec_float_finite;
          local_208._4_4_ = 10;
          local_238 = (undefined1  [16])0x0;
          local_228[0] = 0;
          local_228[1] = 0;
          stack0xfffffffffffffde0 = 0;
          uStack_21b = 0;
          local_218[0] = 0;
          local_218[1] = 0;
          local_218[2] = 0;
          local_20c = false;
          pcVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
          local_238 = *(undefined1 (*) [16])(pcVar12->data)._M_elems;
          local_228._0_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
          uVar3 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
          stack0xfffffffffffffde0 = (undefined5)uVar3;
          uStack_21b = (undefined3)((ulong)uVar3 >> 0x28);
          local_218._0_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 8);
          local_218[2] = pcVar12->exp;
          local_20c = pcVar12->neg;
          local_208._0_4_ = pcVar12->fpclass;
          local_208._4_4_ = pcVar12->prec_elem;
          iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (pcVar14,(cpp_dec_float<50U,_int,_void> *)local_238);
          uVar3 = local_1e8.data._M_elems._0_8_;
          if (iVar8 == 0) {
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)pcVar14,1e-100);
            uVar3 = local_1e8.data._M_elems._0_8_;
          }
        }
      }
      local_1e8.data._M_elems._0_8_ = uVar3;
      local_1f0 = uVar5 + 1;
    } while (local_1f0 != local_1f8);
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveLright(R* vec, int* ridx, int& rn, R eps)
{
   int i, j, k, n;
   int end;
   R x;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   // loop through columns of L
   for(i = 0; i < end; ++i)
   {
      x = vec[lrow[i]];

      // check whether there is a corresponding value in the rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         // apply \f$- x * L_{k,i}\f$ to all corresponding values in rhs/solution VectorBase<R>
         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            n = *idx++;
            updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
            ++val;
         }
      }
   }

   if(l.updateType)                     /* Forest-Tomlin Updates */
   {
      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         StableSum<R> tmp;

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            tmp += vec[*idx++] * (*val++);
         }

         j = lrow[i];
         x = R(tmp);

         if(isNotZero(x, eps))
            updateSolutionVectorLright(x, j, vec[j], ridx, rn);
      }
   }
}